

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<double,_std::allocator<double>_> *
mult_matrix<double>(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *a,vector<double,_std::allocator<double>_> *b)

{
  pointer pvVar1;
  pointer pdVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  allocator_type local_29;
  
  uVar4 = ((long)(a->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar6 = (ulong)((long)(b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar3 = (int)uVar4;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(long)iVar3,&local_29)
  ;
  uVar5 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar5;
  }
  uVar4 = uVar4 & 0xffffffff;
  if (iVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    pvVar1 = (a->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pdVar2[uVar5] =
           *(double *)
            (*(long *)&pvVar1[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + uVar6 * 8) *
           (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start[uVar6] + pdVar2[uVar5];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> mult_matrix(const std::vector<std::vector<T> >& a, std::vector<T> b){
    int n = a.size();
    int m = b.size();
    std::vector<T> ans(n);
    for (int i = 0; i < n; ++i)
            for (int x = 0; x < m; ++x)
                ans[i] += a[i][x]*b[x];
    return ans;
}